

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::to_pose_action(Application *this)

{
  Application *this_local;
  
  this->action = Pose;
  setGhosted(this,true);
  return;
}

Assistant:

void Application::to_pose_action()
{
  action = Action::Pose;
  setGhosted(true);
}